

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O1

void chaiscript::bootstrap::standard_library::
     default_constructible_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
               (string *type,Module *m)

{
  pointer pcVar1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  dispatch::detail::
  build_constructor_<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((_func_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             &sStack_48);
  pcVar1 = (type->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + type->_M_string_length);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&sStack_48,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (sStack_48.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_48.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void default_constructible_type(const std::string &type, Module &m) {
    m.add(constructor<Type()>(), type);
  }